

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O1

void __thiscall
dgRedBackNode::RemoveFixup(dgRedBackNode *this,dgRedBackNode *thisNode,dgRedBackNode **head)

{
  undefined1 *puVar1;
  dgRedBackNode *pdVar2;
  dgRedBackNode *pdVar3;
  bool bVar4;
  dgRedBackNode *this_00;
  
  if (*head != thisNode) {
    do {
      if ((thisNode != (dgRedBackNode *)0x0) && ((thisNode->field_0x20 & 1) != 0)) break;
      this_00 = this->m_left;
      pdVar3 = this;
      if (thisNode == this_00) {
        if (this == (dgRedBackNode *)0x0) {
          return;
        }
        this_00 = this->m_right;
        if (this_00 == (dgRedBackNode *)0x0) goto LAB_00875638;
        if ((this_00->field_0x20 & 1) != 0) {
          this_00->field_0x20 = this_00->field_0x20 & 0xfe;
          this->field_0x20 = this->field_0x20 | 1;
          RotateLeft(this,head);
          this_00 = this->m_right;
          if (this_00 == (dgRedBackNode *)0x0) goto LAB_00875638;
        }
        pdVar2 = this_00->m_left;
        if (((pdVar2 == (dgRedBackNode *)0x0) || ((pdVar2->field_0x20 & 1) == 0)) &&
           ((this_00->m_right == (dgRedBackNode *)0x0 || ((this_00->m_right->field_0x20 & 1) == 0)))
           ) goto LAB_008755c9;
        if ((this_00->m_right == (dgRedBackNode *)0x0) || ((this_00->m_right->field_0x20 & 1) == 0))
        {
          pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
          this_00->field_0x20 = this_00->field_0x20 | 1;
          RotateRight(this_00,head);
          this_00 = this->m_right;
          if (this_00 == (dgRedBackNode *)0x0) goto LAB_00875638;
        }
        this_00->field_0x20 = this_00->field_0x20 & 0xfe | this->field_0x20 & 1;
        if (this_00->m_right != (dgRedBackNode *)0x0) {
          puVar1 = &this_00->m_right->field_0x20;
          *puVar1 = *puVar1 & 0xfe;
        }
        this->field_0x20 = this->field_0x20 & 0xfe;
        RotateLeft(this,head);
LAB_0087562e:
        bVar4 = false;
        thisNode = *head;
      }
      else {
        if (this == (dgRedBackNode *)0x0) {
          return;
        }
        if (this_00 == (dgRedBackNode *)0x0) {
LAB_00875638:
          bVar4 = true;
        }
        else {
          if ((this_00->field_0x20 & 1) != 0) {
            this_00->field_0x20 = this_00->field_0x20 & 0xfe;
            this->field_0x20 = this->field_0x20 | 1;
            RotateRight(this,head);
            this_00 = this->m_left;
            if (this_00 == (dgRedBackNode *)0x0) goto LAB_00875638;
          }
          pdVar2 = this_00->m_right;
          if (((pdVar2 != (dgRedBackNode *)0x0) && ((pdVar2->field_0x20 & 1) != 0)) ||
             ((this_00->m_left != (dgRedBackNode *)0x0 && ((this_00->m_left->field_0x20 & 1) != 0)))
             ) {
            if ((this_00->m_left == (dgRedBackNode *)0x0) ||
               ((this_00->m_left->field_0x20 & 1) == 0)) {
              pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
              this_00->field_0x20 = this_00->field_0x20 | 1;
              RotateLeft(this_00,head);
              this_00 = this->m_left;
              if (this_00 == (dgRedBackNode *)0x0) goto LAB_00875638;
            }
            this_00->field_0x20 = this_00->field_0x20 & 0xfe | this->field_0x20 & 1;
            if (this_00->m_left != (dgRedBackNode *)0x0) {
              puVar1 = &this_00->m_left->field_0x20;
              *puVar1 = *puVar1 & 0xfe;
            }
            this->field_0x20 = this->field_0x20 & 0xfe;
            RotateRight(this,head);
            goto LAB_0087562e;
          }
LAB_008755c9:
          this_00->field_0x20 = this_00->field_0x20 | 1;
          pdVar3 = this->m_parent;
          bVar4 = false;
          thisNode = this;
        }
      }
      if (bVar4) {
        return;
      }
      this = pdVar3;
    } while (thisNode != *head);
  }
  if (thisNode != (dgRedBackNode *)0x0) {
    thisNode->field_0x20 = thisNode->field_0x20 & 0xfe;
  }
  return;
}

Assistant:

void dgRedBackNode::RemoveFixup (dgRedBackNode* const thisNode, dgRedBackNode ** const head) 
{
	dgRedBackNode* ptr = this;
	dgRedBackNode* node = thisNode;
	while ((node != *head) && (!node || node->GetColor() == BLACK)) {
		if (node == ptr->m_left) {
			if (!ptr) {
				return;
			}
			dgRedBackNode* tmp = ptr->m_right;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateLeft (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			if ((!tmp->m_left  || (tmp->m_left->GetColor() == BLACK)) && 
				 (!tmp->m_right || (tmp->m_right->GetColor() == BLACK))) {
				tmp->SetColor(RED);
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) {
				tmp->m_left->SetColor(BLACK);
				tmp->SetColor(RED);
				tmp->RotateRight (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_right) {
				tmp->m_right->SetColor(BLACK) ;
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateLeft (head);
			}
			node = *head;

		} else {
		  	if (!ptr) {
				return;
		  	}
			dgRedBackNode* tmp = ptr->m_left;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateRight (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}

			if ((!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) && 
				 (!tmp->m_left  || (tmp->m_left->GetColor() == BLACK))) {
				tmp->SetColor(RED) ;
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_left || (tmp->m_left->GetColor() == BLACK)) {
				tmp->m_right->SetColor(BLACK) ;
				tmp->SetColor(RED) ;
				tmp->RotateLeft (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_left) {
				tmp->m_left->SetColor(BLACK);
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateRight (head);
			}
			node = *head;
		}
	}
	if (node) {
		node->SetColor(BLACK);
	}
}